

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

bool __thiscall
Memory::HeapBlockMap32::EnsureHeapBlock(HeapBlockMap32 *this,void *address,uint pageCount)

{
  uint *puVar1;
  HeapAllocator *pHVar2;
  L2MapChunk *this_00;
  TrackAllocData local_68;
  L2MapChunk *local_40;
  L2MapChunk *newChunk;
  uint local_30;
  uint local_2c;
  uint currentPageCount;
  uint id2;
  uint id1;
  uint pageCount_local;
  void *address_local;
  HeapBlockMap32 *this_local;
  
  id2 = pageCount;
  _id1 = address;
  address_local = this;
  currentPageCount = GetLevel1Id(address);
  local_2c = GetLevel2Id(_id1);
  newChunk._4_4_ = 0x100 - local_2c;
  puVar1 = min<unsigned_int>(&id2,(uint *)((long)&newChunk + 4));
  local_30 = *puVar1;
  while( true ) {
    if (this->map[currentPageCount] == (L2MapChunk *)0x0) {
      pHVar2 = HeapAllocator::GetNoMemProtectInstance();
      TrackAllocData::CreateTrackAllocData
                (&local_68,(type_info *)&L2MapChunk::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                 ,0x44);
      pHVar2 = HeapAllocator::TrackAllocInfo(pHVar2,&local_68);
      this_00 = (L2MapChunk *)new<Memory::HeapAllocator>(0x2c08,pHVar2,true,0x282340);
      L2MapChunk::L2MapChunk(this_00);
      if (this_00 == (L2MapChunk *)0x0) {
        return false;
      }
      this->map[currentPageCount] = this_00;
      this->count = this->count + 1;
      local_40 = this_00;
    }
    id2 = id2 - local_30;
    if (id2 == 0) break;
    local_2c = 0;
    currentPageCount = currentPageCount + 1;
    puVar1 = min<unsigned_int>(&id2,&L2Count);
    local_30 = *puVar1;
  }
  return true;
}

Assistant:

bool
HeapBlockMap32::EnsureHeapBlock(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);
    uint id2 = GetLevel2Id(address);

    uint currentPageCount = min(pageCount, L2Count - id2);

    while (true)
    {
        if (map[id1] == nullptr)
        {
            L2MapChunk * newChunk = NoMemProtectHeapNewNoThrowZ(L2MapChunk);
            if (newChunk == nullptr)
            {
                // Leave any previously allocated L2MapChunks in place --
                // the concurrent thread may have already accessed them.
                // These will be cleaned up in the Cleanup method, after Sweep is complete.
                return false;
            }

            map[id1] = newChunk;
            count++;
        }

        pageCount -= currentPageCount;
        if (pageCount == 0)
        {
            break;
        }

        id2 = 0;
        id1++;
        currentPageCount = min(pageCount, L2Count);
    }

    return true;
}